

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_no_field_presence.pb.h
# Opt level: O2

ForeignMessage * __thiscall
proto2_nofieldpresence_unittest::TestAllTypes::_internal_mutable_optional_foreign_message
          (TestAllTypes *this)

{
  ForeignMessage *pFVar1;
  Arena *arena;
  
  pFVar1 = (this->field_0)._impl_.optional_foreign_message_;
  if (pFVar1 != (ForeignMessage *)0x0) {
    return pFVar1;
  }
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pFVar1 = (ForeignMessage *)
           google::protobuf::Arena::
           DefaultConstruct<proto2_nofieldpresence_unittest::ForeignMessage>(arena);
  (this->field_0)._impl_.optional_foreign_message_ = pFVar1;
  return pFVar1;
}

Assistant:

inline ::proto2_nofieldpresence_unittest::ForeignMessage* PROTOBUF_NONNULL TestAllTypes::_internal_mutable_optional_foreign_message() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.optional_foreign_message_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::proto2_nofieldpresence_unittest::ForeignMessage>(GetArena());
    _impl_.optional_foreign_message_ = reinterpret_cast<::proto2_nofieldpresence_unittest::ForeignMessage*>(p);
  }
  return _impl_.optional_foreign_message_;
}